

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl<std::__cxx11::string>
          (ParserRefImpl<Catch::clara::detail::Opt> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ref,string *hint)

{
  undefined1 local_30 [24];
  string *hint_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ref_local;
  ParserRefImpl<Catch::clara::detail::Opt> *this_local;
  
  local_30._16_8_ = hint;
  hint_local = ref;
  ref_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  ComposableParserImpl<Catch::clara::detail::Opt>::ComposableParserImpl
            (&this->super_ComposableParserImpl<Catch::clara::detail::Opt>);
  (this->super_ComposableParserImpl<Catch::clara::detail::Opt>).super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__ParserRefImpl_0028d678;
  this->m_optionality = Optional;
  ::std::
  make_shared<Catch::clara::detail::BoundValueRef<std::__cxx11::string>,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  ::std::shared_ptr<Catch::clara::detail::BoundRef>::
  shared_ptr<Catch::clara::detail::BoundValueRef<std::__cxx11::string>,void>
            (&this->m_ref,
             (shared_ptr<Catch::clara::detail::BoundValueRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_30);
  std::
  shared_ptr<Catch::clara::detail::BoundValueRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~shared_ptr((shared_ptr<Catch::clara::detail::BoundValueRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_30);
  ::std::__cxx11::string::string((string *)&this->m_hint,(string *)local_30._16_8_);
  ::std::__cxx11::string::string((string *)&this->m_description);
  return;
}

Assistant:

ParserRefImpl( T &ref, std::string const &hint )
        :   m_ref( std::make_shared<BoundValueRef<T>>( ref ) ),
            m_hint( hint )
        {}